

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_test.pb.cc
# Opt level: O0

void __thiscall proto2_unittest::TestAny::~TestAny(TestAny *this)

{
  TestAny *this_local;
  
  ~TestAny(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TestAny::~TestAny() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestAny)
  SharedDtor(*this);
}